

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUtilitySourceCommand.h
# Opt level: O0

void __thiscall cmUtilitySourceCommand::~cmUtilitySourceCommand(cmUtilitySourceCommand *this)

{
  cmUtilitySourceCommand *this_local;
  
  ~cmUtilitySourceCommand(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

cmCommand* Clone() override { return new cmUtilitySourceCommand; }